

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug_Utilities.cpp
# Opt level: O3

void Nova::Function_Is_Not_Defined(char *function,char *file,uint line,type_info *type)

{
  size_t sVar1;
  ostream *poVar2;
  runtime_error *this;
  string error;
  char local_39;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  sprintf(Function_Is_Not_Defined::buffer,"%s:%s:%d: Function not defined by %s",file,function,
          (ulong)line,*(char **)(type + 8) + (**(char **)(type + 8) == '*'));
  local_38 = local_28;
  sVar1 = strlen(Function_Is_Not_Defined::buffer);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,Function_Is_Not_Defined::buffer,
             Function_Is_Not_Defined::buffer + sVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr,"\n",1);
  poVar2 = Log::(anonymous_namespace)::cerr;
  std::__ostream_insert<char,std::char_traits<char>>
            (Log::(anonymous_namespace)::cerr,"\n*** ERROR: ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_38,local_30);
  local_39 = '\n';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Nova::Function_Is_Not_Defined(const char* function,const char* file,unsigned int line,const std::type_info& type)
{
    static char buffer[2048];
    sprintf(buffer,"%s:%s:%d: Function not defined by %s",file,function,line,type.name());
    std::string error(buffer);
    Log::cout<<std::flush;Log::cerr<<"\n";
    Log::cerr<<"\n*** ERROR: "<<error<<'\n'<<std::endl;
    throw std::runtime_error(error);
}